

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# treewalker.cpp
# Opt level: O1

void __thiscall TreeWalker::acceptConnections(TreeWalker *this,DomConnections *connections)

{
  QArrayData *pQVar1;
  ulong uVar2;
  DomConnection **ppDVar3;
  int i;
  ulong uVar4;
  
  uVar4 = 0;
  while( true ) {
    pQVar1 = &((connections->m_connection).d.d)->super_QArrayData;
    uVar2 = (connections->m_connection).d.size;
    if (pQVar1 != (QArrayData *)0x0) {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,8,0x10);
      }
    }
    if (uVar2 <= uVar4) break;
    pQVar1 = &((connections->m_connection).d.d)->super_QArrayData;
    ppDVar3 = (connections->m_connection).d.ptr;
    if (pQVar1 == (QArrayData *)0x0) {
      (*this->_vptr_TreeWalker[0x1e])(this,ppDVar3[uVar4]);
    }
    else {
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
      (*this->_vptr_TreeWalker[0x1e])(this,ppDVar3[uVar4]);
      LOCK();
      (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i =
           (pQVar1->ref_)._q_value.super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((pQVar1->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate(pQVar1,8,0x10);
      }
    }
    uVar4 = uVar4 + 1;
  }
  return;
}

Assistant:

void TreeWalker::acceptConnections(DomConnections *connections)
{
    for (int i=0; i<connections->elementConnection().size(); ++i)
        acceptConnection(connections->elementConnection().at(i));
}